

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void glfw_key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  float fVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined4 in_register_00000014;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char **ppcVar7;
  bool bVar8;
  double dVar9;
  Rotation local_40;
  
  if (action != 1) {
    return;
  }
  if (key == 0x57) {
    uVar5 = (uint)wireframe;
    wireframe = !wireframe;
    glPolygonMode(0x408,uVar5 + 0x1b01,CONCAT44(in_register_00000014,scancode));
    return;
  }
  if (key == 0x100) {
    glfwSetWindowShouldClose(window,1);
    return;
  }
  if (key - 0x31U < 9) {
    legendre_index = (size_t)(key - 0x31U);
    variable = legendre_params + legendre_index;
    pcVar6 = legendre_param_names[legendre_index];
    var_name = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x18a430);
    }
    else {
      sVar2 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
    poVar3 = std::ostream::_M_insert<double>((double)*variable);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return;
  }
  if (0x107 < key) {
    switch(key) {
    case 0x142:
      goto switchD_00110d69_caseD_4d;
    case 0x143:
    case 0x147:
    case 0x149:
    case 0x14a:
    case 0x14b:
    case 0x14c:
      goto switchD_00110d69_caseD_3e;
    case 0x144:
      goto switchD_00110d69_caseD_4a;
    case 0x145:
      goto switchD_00110d69_caseD_4b;
    case 0x146:
      goto switchD_00110d69_caseD_4c;
    case 0x148:
      goto switchD_00110d69_caseD_49;
    case 0x14d:
      goto switchD_00110d99_caseD_14d;
    case 0x14e:
      goto switchD_00110d69_caseD_3d;
    default:
      if (key == 0x108) {
        fVar1 = *variable + -0.1;
      }
      else {
        if (key != 0x109) {
          return;
        }
        fVar1 = *variable + 0.1;
      }
      *variable = fVar1;
LAB_0011112a:
      poVar3 = std::operator<<((ostream *)&std::cout,var_name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      poVar3 = std::ostream::_M_insert<double>((double)*variable);
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00111172;
    }
  }
  switch(key) {
  case 0x3d:
    goto switchD_00110d69_caseD_3d;
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x53:
    break;
  case 0x45:
    rotationFrames = rotationFrames + (int)theta_n;
    break;
  case 0x49:
switchD_00110d69_caseD_49:
    dVar9 = (double)glfwGetTime();
    local_40.startTime = (float)dVar9;
    local_40.axis.field_0._0_8_ = 0x3f800000;
    goto LAB_00110f49;
  case 0x4a:
switchD_00110d69_caseD_4a:
    dVar9 = (double)glfwGetTime();
    local_40.startTime = (float)dVar9;
    local_40.axis.field_0._0_8_ = 0x3f80000000000000;
    goto LAB_00110f49;
  case 0x4b:
switchD_00110d69_caseD_4b:
    if (rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
        super__Vector_impl_data._M_start) {
      rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
      super__Vector_impl_data._M_finish =
           rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    rotationFrames = 0;
    antiRotationFrames = 0;
    break;
  case 0x4c:
switchD_00110d69_caseD_4c:
    dVar9 = (double)glfwGetTime();
    local_40.startTime = (float)dVar9;
    local_40.axis.field_0._0_8_ = 0xbf80000000000000;
    goto LAB_00110f49;
  case 0x4d:
switchD_00110d69_caseD_4d:
    dVar9 = (double)glfwGetTime();
    local_40.startTime = (float)dVar9;
    local_40.axis.field_0._0_8_ = 0xbf800000;
LAB_00110f49:
    local_40.axis.field_0.field_0.z = 0.0;
    std::vector<Rotation,_std::allocator<Rotation>_>::emplace_back<Rotation>(&rotations,&local_40);
    break;
  case 0x50:
    ppcVar7 = legendre_param_names;
    lVar4 = 0;
    do {
      pcVar6 = *ppcVar7;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x18a430);
      }
      else {
        sVar2 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)legendre_params + lVar4));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar4 = lVar4 + 4;
      ppcVar7 = ppcVar7 + 1;
    } while (lVar4 != 0x24);
    break;
  case 0x52:
    rotationFrames = rotationFrames + (int)theta_n;
    antiRotationFrames = antiRotationFrames + (int)theta_n;
    break;
  case 0x54:
    textured = !textured;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Textured = ",0xb);
    pcVar6 = "false";
    if ((ulong)textured != 0) {
      pcVar6 = "true";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar6,(ulong)textured ^ 5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  default:
    if (key != 0x2d) {
      if (key != 0x30) {
        return;
      }
      *variable = 0.0;
      goto LAB_0011112a;
    }
switchD_00110d99_caseD_14d:
    bVar8 = (mods & 1U) == 0;
    lVar4 = -0x14;
    if (bVar8) {
      lVar4 = -2;
    }
    theta_n = lVar4 + theta_n;
    phi_n = ((ulong)-(uint)bVar8 | 0xfffffffffffffff6) + phi_n;
    if (theta_n < 0x20) {
      theta_n = 0x20;
    }
    if (phi_n < 0x10) {
      phi_n = 0x10;
    }
    goto LAB_00110fca;
  }
switchD_00110d69_caseD_3e:
  return;
switchD_00110d69_caseD_3d:
  lVar4 = 0x14;
  if ((mods & 1U) == 0) {
    lVar4 = 2;
  }
  theta_n = theta_n + lVar4;
  phi_n = (ulong)(mods & 1U) * 9 + phi_n + 1;
LAB_00110fca:
  regenerateIndices();
  regenerateSpherePositions();
  regenerateSHBuffer();
LAB_00111172:
  regenerateBuffer();
  return;
}

Assistant:

static void glfw_key_callback(GLFWwindow* window, int key, int scancode, int action, int mods) {
    if (action != GLFW_PRESS) return;

    if (key == GLFW_KEY_ESCAPE) {
        glfwSetWindowShouldClose(window, true);
    } else if (key == GLFW_KEY_W) {
        wireframe = !wireframe;
        glPolygonMode(GL_FRONT_AND_BACK, wireframe ? GL_LINE : GL_FILL);
    } else if (key >= GLFW_KEY_1 && key <= GLFW_KEY_9) {
        legendre_index = size_t(key - GLFW_KEY_1);
        variable = &legendre_params[legendre_index];
        var_name = legendre_param_names[legendre_index];
        cout << var_name << " = " << *variable << endl;
    } else if (key == GLFW_KEY_0) {
        *variable = 0;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_UP) {
        *variable += 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_DOWN) {
        *variable -= 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_P) {
        for (int c = 0; c < 9; c++) {
            cout << legendre_param_names[c] << " = " << legendre_params[c] << endl;
        }
    }

    else if (key == GLFW_KEY_T) {
        textured = !textured;
        cout << "Textured = " << (textured ? "true" : "false") << endl;
    }

    else if (key == GLFW_KEY_KP_ADD || key == GLFW_KEY_EQUAL) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n += 20;
            phi_n += 10;
        } else {
            theta_n += 2;
            phi_n += 1;
        }
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }
    else if (key == GLFW_KEY_KP_SUBTRACT || key == GLFW_KEY_MINUS) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n -= 20;
            phi_n -= 10;
        } else {
            theta_n -= 2;
            phi_n -= 1;
        }
        if (theta_n < MIN_THETA_N) theta_n = MIN_THETA_N;
        if (phi_n < MIN_PHI_N) phi_n = MIN_PHI_N;
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }

    else if (key == GLFW_KEY_KP_8 || key == GLFW_KEY_I) {
        rotations.push_back({float(glfwGetTime()), vec3(1, 0, 0)});
    } else if (key == GLFW_KEY_KP_4 || key == GLFW_KEY_J) {
        rotations.push_back({float(glfwGetTime()), vec3(0, 1, 0)});
    } else if (key == GLFW_KEY_KP_2 || key == GLFW_KEY_M) {
        rotations.push_back({float(glfwGetTime()), vec3(-1, 0, 0)});
    } else if (key == GLFW_KEY_KP_6 || key == GLFW_KEY_L) {
        rotations.push_back({float(glfwGetTime()), vec3(0, -1, 0)});
    } else if (key == GLFW_KEY_KP_5 || key == GLFW_KEY_K) {
        rotations.clear();
        rotationFrames = 0;
        antiRotationFrames = 0;
    }

    else if (key == GLFW_KEY_E) {
        rotationFrames += theta_n;
    } else if (key == GLFW_KEY_R) {
        rotationFrames += theta_n;
        antiRotationFrames += theta_n;
    }
}